

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O2

RpcValue __thiscall
miniros::master::Master::unregisterSubscriber
          (Master *this,string *caller_id,string *topic,string *caller_api,Connection *connection)

{
  Error EVar1;
  XmlRpcValue *pXVar2;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  long in_R9;
  RpcValue RVar3;
  allocator<char> local_196;
  allocator<char> local_195;
  int ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  XmlRpcValue local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  RequesterInfo requesterInfo;
  
  XmlRpc::XmlRpcValue::Array((XmlRpcValue *)this,3);
  RequesterInfo::RequesterInfo(&requesterInfo);
  EVar1 = RequesterInfo::assign(&requesterInfo,topic,*(int *)(in_R9 + 8));
  if (EVar1.code != Ok) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (unregisterSubscriber::loc.initialized_ == false) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,"miniros.unknown_package",(allocator<char> *)&local_160);
      console::initializeLogLocation(&unregisterSubscriber::loc,&local_190,Warn);
      ::std::__cxx11::string::~string((string *)&local_190);
    }
    if (unregisterSubscriber::loc.level_ != Warn) {
      console::setLogLocationLevel(&unregisterSubscriber::loc,Warn);
      console::checkLogLocationEnabled(&unregisterSubscriber::loc);
    }
    if (unregisterSubscriber::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,unregisterSubscriber::loc.logger_,
                     unregisterSubscriber::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/master.cpp"
                     ,0x13e,
                     "Master::RpcValue miniros::master::Master::unregisterSubscriber(const std::string &, const std::string &, const std::string &, Connection *)"
                     ,"Failed to read network address of caller %s",(topic->_M_dataplus)._M_p);
    }
  }
  ::std::__cxx11::string::_M_assign((string *)&requesterInfo.callerApi);
  ret = MasterHandler::unregisterSubscriber
                  ((MasterHandler *)(caller_id + 0x13),&requesterInfo,caller_api);
  local_190._M_dataplus._M_p._0_4_ = 1;
  pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
  XmlRpc::XmlRpcValue::operator=(pXVar2,(int *)&local_190);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"unregistered ",&local_195);
  ::std::operator+(&local_100,&local_120,topic);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"as provder of ",&local_196);
  ::std::operator+(&local_160,&local_100,&local_140);
  ::std::operator+(&local_190,&local_160,caller_api);
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_170,&local_190);
  pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,1);
  XmlRpc::XmlRpcValue::operator=(pXVar2,&local_170);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&local_170);
  ::std::__cxx11::string::~string((string *)&local_190);
  ::std::__cxx11::string::~string((string *)&local_160);
  ::std::__cxx11::string::~string((string *)&local_140);
  ::std::__cxx11::string::~string((string *)&local_100);
  ::std::__cxx11::string::~string((string *)&local_120);
  pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,2);
  XmlRpc::XmlRpcValue::operator=(pXVar2,&ret);
  RequesterInfo::~RequesterInfo(&requesterInfo);
  RVar3._value.asDouble = extraout_RDX.asDouble;
  RVar3._0_8_ = this;
  return RVar3;
}

Assistant:

Master::RpcValue Master::unregisterSubscriber(
  const std::string& caller_id, const std::string& topic, const std::string& caller_api, Connection* connection)
{
  RpcValue res = RpcValue::Array(3);
  RequesterInfo requesterInfo;
  if (!requesterInfo.assign(caller_id, connection->getfd())) {
    MINIROS_WARN("Failed to read network address of caller %s", caller_id.c_str());
  }
  requesterInfo.callerApi = caller_api;

  int ret = m_handler.unregisterSubscriber(requesterInfo, topic);
  res[0] = 1;
  res[1] = std::string("unregistered ") + caller_id + std::string("as provder of ") + topic;
  res[2] = ret;
  return res;
}